

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O1

int duckdb::Comparators::TemplatedCompareVal<duckdb::string_t>
              (data_ptr_t *left_ptr,data_ptr_t *right_ptr)

{
  bool bVar1;
  int iVar2;
  string_t left_val;
  string_t right_val;
  anon_union_16_2_67f50693_for_value local_28;
  anon_union_16_2_67f50693_for_value local_18;
  
  local_28._0_8_ = *(undefined8 *)*left_ptr;
  local_28.pointer.ptr = (char *)*(ulong *)((long)*left_ptr + 8);
  local_18._0_8_ = *(undefined8 *)*right_ptr;
  local_18.pointer.ptr = (char *)*(ulong *)((long)*right_ptr + 8);
  if (local_28._0_8_ == local_18._0_8_) {
    if (local_28.pointer.ptr == local_18.pointer.ptr) {
      return 0;
    }
    if ((0xc < (local_28._0_8_ & 0xffffffff)) &&
       (iVar2 = bcmp(local_28.pointer.ptr,local_18.pointer.ptr,local_28._0_8_ & 0xffffffff),
       iVar2 == 0)) {
      return 0;
    }
  }
  bVar1 = string_t::StringComparisonOperators::GreaterThan
                    ((string_t *)&local_18.pointer,(string_t *)&local_28.pointer);
  return -(uint)bVar1 | 1;
}

Assistant:

int Comparators::TemplatedCompareVal(const data_ptr_t &left_ptr, const data_ptr_t &right_ptr) {
	const auto left_val = Load<T>(left_ptr);
	const auto right_val = Load<T>(right_ptr);
	if (Equals::Operation<T>(left_val, right_val)) {
		return 0;
	} else if (LessThan::Operation<T>(left_val, right_val)) {
		return -1;
	} else {
		return 1;
	}
}